

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgenericshape.cpp
# Opt level: O2

TPZTransform<double> *
GetSideTransform<pzshape::TPZShapePoint>
          (TPZTransform<double> *__return_storage_ptr__,int side,int trans_id)

{
  TPZFNMatrix<3,_double> *this;
  MElementType MVar1;
  TPZFMatrix<double> resul_mult;
  TPZFMatrix<double> res1;
  TPZTransform<double> TransParametric;
  
  MVar1 = pztopology::TPZPoint::Type(side);
  pztopology::TPZPoint::TransformElementToSide(__return_storage_ptr__,side);
  TPZTransform<double>::TPZTransform(&TransParametric,1,1);
  if (MVar1 == EOned) {
    pzshape::TPZShapeLinear::ParametricTransform((TPZTransform<double> *)&resul_mult,trans_id);
    TPZTransform<double>::operator=(&TransParametric,(TPZTransform<double> *)&resul_mult);
  }
  else if (MVar1 == ETriangle) {
    pzshape::TPZShapeTriang::ParametricTransform((TPZTransform<double> *)&resul_mult,trans_id);
    TPZTransform<double>::operator=(&TransParametric,(TPZTransform<double> *)&resul_mult);
  }
  else {
    if (MVar1 != EQuadrilateral) goto LAB_00f51a27;
    pzshape::TPZShapeQuad::ParametricTransform((TPZTransform<double> *)&resul_mult,trans_id);
    TPZTransform<double>::operator=(&TransParametric,(TPZTransform<double> *)&resul_mult);
  }
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)&resul_mult);
LAB_00f51a27:
  TPZFMatrix<double>::TPZFMatrix(&resul_mult);
  (*TransParametric.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x25])
            (&TransParametric.fMult,&__return_storage_ptr__->fMult,&resul_mult,0);
  TPZFMatrix<double>::operator=
            (&(__return_storage_ptr__->fMult).super_TPZFMatrix<double>,&resul_mult);
  TPZFMatrix<double>::TPZFMatrix(&res1);
  this = &__return_storage_ptr__->fSum;
  (*TransParametric.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
    super_TPZSavable._vptr_TPZSavable[0x25])(&TransParametric.fMult,this,&res1,0);
  TPZFMatrix<double>::operator=(&this->super_TPZFMatrix<double>,&res1);
  TPZFMatrix<double>::operator+=
            (&this->super_TPZFMatrix<double>,(TPZMatrix<double> *)&TransParametric.fSum);
  TPZFMatrix<double>::~TPZFMatrix(&res1);
  TPZFMatrix<double>::~TPZFMatrix(&resul_mult);
  TPZTransform<double>::~TPZTransform(&TransParametric);
  return __return_storage_ptr__;
}

Assistant:

TPZTransform<REAL> GetSideTransform(const int side, int trans_id) {
    
    MElementType type_side = TSHAPE::Type(side);
    TPZTransform<REAL> TransElToSide = TSHAPE::TransformElementToSide(side);
    
    TPZTransform<REAL> TransParametric(1,1);
    switch (type_side) {
        case EOned:
        {
            TransParametric = pzshape::TPZShapeLinear::ParametricTransform(trans_id);
        }
            break;
        case EQuadrilateral:
        {
            TransParametric = pzshape::TPZShapeQuad::ParametricTransform(trans_id);
        }
            break;
        case ETriangle:
        {
            TransParametric = pzshape::TPZShapeTriang::ParametricTransform(trans_id);
        }
            break;
        default:
            break;
    }
    //why TSHAPE::Dimension>2 here??
    if ((side == TSHAPE::NSides - 1) && TSHAPE::Dimension>2) {
        
        return TransElToSide;
    }
    else{
        TPZFMatrix<REAL> resul_mult;
        TransParametric.Mult().Multiply(TransElToSide.Mult(), resul_mult);
        TransElToSide.Mult() = resul_mult;
        TPZFMatrix<REAL> res1;
        TransParametric.Mult().Multiply( TransElToSide.Sum(), res1);
        TransElToSide.Sum() =res1;
        TransElToSide.Sum() += TransParametric.Sum();
        
    }
    
    return TransElToSide;
    
}